

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLElement::~XMLElement(XMLElement *this)

{
  XMLAttribute *pXVar1;
  XMLAttribute *next;
  XMLElement *this_local;
  
  (this->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_001a3800;
  while (this->_rootAttribute != (XMLAttribute *)0x0) {
    pXVar1 = this->_rootAttribute->_next;
    DeleteAttribute(this->_rootAttribute);
    this->_rootAttribute = pXVar1;
  }
  XMLNode::~XMLNode(&this->super_XMLNode);
  return;
}

Assistant:

XMLElement::~XMLElement()
{
    while( _rootAttribute ) {
        XMLAttribute* next = _rootAttribute->_next;
        DeleteAttribute( _rootAttribute );
        _rootAttribute = next;
    }
}